

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O3

void object_flavor_aware(player *p,object *obj)

{
  uint32_t *puVar1;
  object_kind *kind;
  store *psVar2;
  _Bool _Var3;
  level_map_conflict *plVar4;
  loc grid;
  object *poVar5;
  chunk_conflict *pcVar6;
  int y;
  long lVar7;
  int x;
  
  poVar5 = obj->known;
  if (poVar5 == (object *)0x0) {
    __assert_fail("obj->known",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-knowledge.c"
                  ,0x938,"void object_flavor_aware(struct player *, struct object *)");
  }
  kind = obj->kind;
  if (kind->aware == false) {
    kind->aware = true;
    poVar5->effect = obj->effect;
    _Var3 = kind_is_ignored_unaware(kind);
    if (_Var3) {
      kind_ignore_when_aware(obj->kind);
    }
    puVar1 = &p->upkeep->notice;
    *puVar1 = *puVar1 | 2;
    for (poVar5 = p->gear; poVar5 != (object *)0x0; poVar5 = poVar5->next) {
      object_set_base_known(p,poVar5);
    }
    if (0 < world->num_towns) {
      lVar7 = 0;
      plVar4 = world;
      do {
        psVar2 = plVar4->towns[lVar7].stores;
        for (; psVar2 != (store *)0x0; psVar2 = psVar2->next) {
          for (poVar5 = psVar2->stock; poVar5 != (object *)0x0; poVar5 = poVar5->next) {
            object_set_base_known(p,poVar5);
          }
          plVar4 = world;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < plVar4->num_towns);
    }
    if ((cave != (chunk_conflict *)0x0) && (1 < cave->height)) {
      y = 1;
      pcVar6 = cave;
      do {
        if (1 < pcVar6->width) {
          x = 1;
          do {
            grid = (loc)loc(x,y);
            poVar5 = square_object(cave,grid);
            if (poVar5 != (object *)0x0) {
              do {
                if (poVar5->kind == obj->kind) {
                  square_light_spot((chunk *)cave,grid);
                  break;
                }
                poVar5 = poVar5->next;
              } while (poVar5 != (object *)0x0);
            }
            x = x + 1;
            pcVar6 = cave;
          } while (x < cave->width);
        }
        y = y + 1;
      } while (y < pcVar6->height);
    }
  }
  return;
}

Assistant:

void object_flavor_aware(struct player *p, struct object *obj)
{
	int y, x, i;
	struct object *obj1;

	assert(obj->known);
	if (obj->kind->aware) return;
	obj->kind->aware = true;
	obj->known->effect = obj->effect;

	/* Fix ignore/autoinscribe */
	if (kind_is_ignored_unaware(obj->kind))
		kind_ignore_when_aware(obj->kind);
	p->upkeep->notice |= PN_IGNORE;

	/* Update player objects */
	for (obj1 = p->gear; obj1; obj1 = obj1->next)
		object_set_base_known(p, obj1);

	/* Store objects */
	for (i = 0; i < world->num_towns; i++) {
		struct town *town = &world->towns[i];
		struct store *s = town->stores;
		while (s) {
			for (obj1 = s->stock; obj1; obj1 = obj1->next) {
				object_set_base_known(p, obj1);
			}
			s = s->next;
		}
	}

	/* Quit if no dungeon yet */
	if (!cave) return;

	/* Some objects change tile on awareness, so update display for all
	 * floor objects of this kind */
	for (y = 1; y < cave->height; y++) {
		for (x = 1; x < cave->width; x++) {
			bool light = false;
			const struct object *floor_obj;
			struct loc grid = loc(x, y);

			for (floor_obj = square_object(cave, grid); floor_obj;
				 floor_obj = floor_obj->next)
				if (floor_obj->kind == obj->kind) {
					light = true;
					break;
				}

			if (light) square_light_spot(cave, grid);
		}
	}
}